

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O1

Type * google::protobuf::internal::
       GenericTypeHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::New(Arena *arena,Type *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  Type *pTVar4;
  
  paVar1 = &value->field_2;
  if (arena == (Arena *)0x0) {
    pTVar4 = (Type *)operator_new(0x20);
  }
  else {
    pTVar4 = (Type *)ThreadSafeArena::AllocateFromStringBlock(&arena->impl_);
  }
  (pTVar4->_M_dataplus)._M_p = (pointer)&pTVar4->field_2;
  pcVar2 = (value->_M_dataplus)._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar3 = *(undefined8 *)((long)&value->field_2 + 8);
    (pTVar4->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&pTVar4->field_2 + 8) = uVar3;
  }
  else {
    (pTVar4->_M_dataplus)._M_p = pcVar2;
    (pTVar4->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  pTVar4->_M_string_length = value->_M_string_length;
  (value->_M_dataplus)._M_p = (pointer)paVar1;
  value->_M_string_length = 0;
  (value->field_2)._M_local_buf[0] = '\0';
  return pTVar4;
}

Assistant:

static PROTOBUF_NOINLINE Type* New(Arena* arena, Type&& value) {
    return Arena::Create<Type>(arena, std::move(value));
  }